

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O1

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkTernary
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeTri *pnode,Context context)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = (**(this->super_WalkerPolicyTest).
             super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
             _vptr_WalkerPolicyBase)(this,pnode->pnode1);
  uVar1 = (undefined1)iVar3;
  bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
  if (bVar2) {
    bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
    uVar1 = 1;
    if (bVar2) {
      iVar3 = (**(this->super_WalkerPolicyTest).
                 super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                 _vptr_WalkerPolicyBase)(this,pnode->pnode2,context);
      uVar1 = (undefined1)iVar3;
      bVar2 = ThreadContext::IsCurrentStackAvailable(0x2400);
      if (bVar2) {
        iVar3 = (**(this->super_WalkerPolicyTest).
                   super_WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>.
                   _vptr_WalkerPolicyBase)(this,pnode->pnode3,context);
        return SUB41(iVar3,0);
      }
    }
  }
  return (ResultType)uVar1;
}

Assistant:

ResultType WalkTernary(ParseNodeTri *pnode, Context context)
    {
        ResultType result = WalkFirstChild(pnode->pnode1, context);
        if (ContinueWalk(result))
        {
            result = WalkNode(pnode, context);
            if (ContinueWalk(result))
            {
                result = WalkSecondChild(pnode->pnode2, context);
                if (ContinueWalk(result)) result = WalkNthChild(pnode, pnode->pnode3, context);
            }
        }
        return result;
    }